

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void cleanup_stores(void)

{
  owner *poVar1;
  object_buy *poVar2;
  store *psVar3;
  store *store;
  wchar_t i;
  object_buy *buy_next;
  object_buy *buy;
  owner *o_next;
  owner *o;
  
  if (stores != (store *)0x0) {
    for (store._4_4_ = 0; psVar3 = stores, store._4_4_ < (int)(uint)z_info->store_max;
        store._4_4_ = store._4_4_ + 1) {
      mem_free(stores[store._4_4_].always_table);
      mem_free(psVar3[store._4_4_].normal_table);
      o_next = psVar3[store._4_4_].owners;
      while (o_next != (owner *)0x0) {
        poVar1 = o_next->next;
        string_free(o_next->name);
        mem_free(o_next);
        o_next = poVar1;
      }
      buy_next = psVar3[store._4_4_].buy;
      while (buy_next != (object_buy *)0x0) {
        poVar2 = buy_next->next;
        mem_free(buy_next);
        buy_next = poVar2;
      }
      string_free(psVar3[store._4_4_].name);
    }
    mem_free(stores);
  }
  return;
}

Assistant:

static void cleanup_stores(void)
{
	struct owner *o, *o_next;
	struct object_buy *buy, *buy_next;
	int i;

	if (!stores)
		return;

	/* Free the store tables and owners */
	for (i = 0; i < z_info->store_max; i++) {
		/* Get the store */
		struct store *store = &stores[i];

		/* Free the store inventory */
		mem_free(store->always_table);
		mem_free(store->normal_table);

		for (o = store->owners; o; o = o_next) {
			o_next = o->next;
			string_free(o->name);
			mem_free(o);
		}

		for (buy = store->buy; buy; buy = buy_next) {
			buy_next = buy->next;
			mem_free(buy);
		}

		string_free((void *)store->name);
	}
	mem_free(stores);
}